

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalBranchDirectiveSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000088;
  TokenList *in_stack_00000090;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Token *args_1;
  __fn *args;
  
  args_1 = (Token *)__child_stack;
  args = __fn;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*> *)0x7733cc);
  deepClone<slang::syntax::ConditionalDirectiveExpressionSyntax>
            ((ConditionalDirectiveExpressionSyntax *)__fn,(BumpAllocator *)__child_stack);
  deepClone(in_stack_00000090,in_stack_00000088);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::syntax::TokenList&>
                     (unaff_retaddr,(SyntaxKind *)args,args_1,
                      (ConditionalDirectiveExpressionSyntax *)TVar2.info,TVar2._0_8_);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalBranchDirectiveSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalBranchDirectiveSyntax>(
        node.kind,
        node.directive.deepClone(alloc),
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.expr, alloc),
        *deepClone(node.disabledTokens, alloc)
    );
}